

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

int main(void)

{
  int opt;
  
  compact_deleted_doc_test();
  opt = 0;
  compact_upto_test(false);
  compact_upto_test(true);
  compact_upto_last_wal_flush_bid_check();
  wal_delete_compact_upto_test();
  compact_upto_with_circular_reuse_test();
  do {
    compact_upto_overwrite_test(opt);
    opt = opt + 1;
  } while (opt != 4);
  compact_with_snapshot_open_multi_kvs_test();
  compact_with_snapshot_open_test();
  compact_upto_post_snapshot_test();
  compact_upto_twice_test();
  compaction_callback_test(true);
  compaction_callback_test(false);
  compact_wo_reopen_test();
  compact_with_reopen_test();
  compact_reopen_with_iterator();
  compact_reopen_named_kvs();
  estimate_space_upto_test(false);
  estimate_space_upto_test(true);
  unlink_after_compaction_test();
  db_compact_overwrite();
  db_compact_during_doc_delete((void *)0x0);
  compaction_with_concurrent_transaction_test();
  compaction_with_concurrent_update_test();
  auto_compaction_with_custom_cmp_function();
  compaction_daemon_test(0x14);
  auto_compaction_with_concurrent_insert_test(0x14);
  compaction_cancellation_test(COMPACTION_CANCEL_MODE);
  return 0;
}

Assistant:

int main(){
    int i;

    compact_deleted_doc_test();
    compact_upto_test(false); // single kv instance in file
    compact_upto_test(true); // multiple kv instance in file
    compact_upto_last_wal_flush_bid_check();
    wal_delete_compact_upto_test();
    compact_upto_with_circular_reuse_test();
    for (i=0;i<4;++i) {
        compact_upto_overwrite_test(i);
    }
    compact_with_snapshot_open_multi_kvs_test();
    compact_with_snapshot_open_test();
    compact_upto_post_snapshot_test();
    compact_upto_twice_test();
    compaction_callback_test(true); // multi kv instance mode
    compaction_callback_test(false); // single kv instance mode
    compact_wo_reopen_test();
    compact_with_reopen_test();
#if !defined(THREAD_SANITIZER)
    compact_reopen_with_iterator();
#endif
    compact_reopen_named_kvs();
    estimate_space_upto_test(false); // single kv instance in file
    estimate_space_upto_test(true); // multiple kv instance in file
    // Since we call unlink() to the old file after compaction,
    // cloning old file after the compaction doesn't work anymore.
    // So we temporarily disable this test.
    //auto_recover_compact_ok_test();
    unlink_after_compaction_test();
    db_compact_overwrite();
    db_compact_during_doc_delete(NULL);
    compaction_with_concurrent_transaction_test();
    compaction_with_concurrent_update_test();
    auto_compaction_with_custom_cmp_function();
    compaction_daemon_test(20);
    auto_compaction_with_concurrent_insert_test(20);
    compaction_cancellation_test(COMPACTION_CANCEL_MODE);
    // Disable it temporarily until it is resolved.
    //compaction_cancellation_test(COMPACTION_ROLLBACK_MODE);

    return 0;
}